

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int extra_setup_location(isoent *isoent,int location)

{
  int local_24;
  extr_rec *peStack_20;
  int cnt;
  extr_rec *rec;
  int location_local;
  isoent *isoent_local;
  
  local_24 = 0;
  peStack_20 = (isoent->extr_rec_list).first;
  (isoent->extr_rec_list).current = peStack_20;
  rec._4_4_ = location;
  for (; peStack_20 != (extr_rec *)0x0; peStack_20 = peStack_20->next) {
    local_24 = local_24 + 1;
    peStack_20->location = rec._4_4_;
    peStack_20->offset = 0;
    rec._4_4_ = rec._4_4_ + 1;
  }
  return local_24;
}

Assistant:

static int
extra_setup_location(struct isoent *isoent, int location)
{
	struct extr_rec *rec;
	int cnt;

	cnt = 0;
	rec = isoent->extr_rec_list.first;
	isoent->extr_rec_list.current = rec;
	while (rec) {
		cnt++;
		rec->location = location++;
		rec->offset = 0;
		rec = rec->next;
	}
	return (cnt);
}